

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O2

void __thiscall
QHeaderViewPrivate::resizeSections
          (QHeaderViewPrivate *this,ResizeMode globalMode,bool useGlobalMode)

{
  HeaderMode HVar1;
  QHeaderView *this_00;
  QWidgetData *pQVar2;
  int iVar3;
  uint uVar4;
  ResizeMode RVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ResizeMode RVar9;
  ResizeMode RVar10;
  ulong uVar11;
  ulong uVar12;
  int i;
  uint uVar13;
  uint uVar14;
  value_type_conflict3 _t3;
  long in_FS_OFFSET;
  bool bVar15;
  uint local_90;
  int local_8c;
  ulong local_70;
  QArrayDataPointer<int> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QHeaderView **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  QBasicTimer::stop();
  QAbstractItemViewPrivate::executePostedLayout(&this->super_QAbstractItemViewPrivate);
  if ((this->headerMode != InitialNoSectionMemoryUsage) ||
     (((((this->stretchSections != 0 || (this->stretchLastSection != false)) ||
        (this->contentsSections != 0)) || ((useGlobalMode && (this->globalResizeMode != Custom))))
      && (setHeaderMode(this,FlexibleWithSectionMemoryUsage),
         this->headerMode != InitialNoSectionMemoryUsage)))) {
    iVar6 = (int)(this->sectionItems).d.size;
  }
  else {
    iVar6 = (int)this->countInNoSectionItemsMode;
  }
  if ((iVar6 != 0) && (this->resizeRecursionBlock == false)) {
    this->resizeRecursionBlock = true;
    (this->cachedSizeHint).wd = -1;
    (this->cachedSizeHint).ht = -1;
    uVar4 = QHeaderView::visualIndex(this_00,this->lastSectionLogicalIdx);
    uVar11 = (ulong)uVar4;
    if (useGlobalMode) {
      uVar11 = 0xffffffff;
    }
    bVar15 = this->orientation != Horizontal;
    pQVar2 = ((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    uVar14 = ((&(pQVar2->crect).x2)[bVar15].m_i - (&(pQVar2->crect).x1)[bVar15].m_i) + 1;
    if (this->stretchLastSection == false) {
      uVar11 = 0xffffffff;
    }
    local_58.size = 0;
    local_58.d = (Data *)0x0;
    local_58.ptr = (int *)0x0;
    uVar12 = 0;
    uVar13 = 0;
    do {
      if (this->headerMode == InitialNoSectionMemoryUsage) {
        if ((long)(int)this->countInNoSectionItemsMode <= (long)uVar12) goto LAB_004f78e2;
LAB_004f77c6:
        iVar6 = (int)uVar12;
        RVar5 = globalMode;
        if (useGlobalMode) {
LAB_004f77e1:
          if (RVar5 != Stretch) {
            if ((RVar5 & ~Custom) == Interactive) {
              iVar7 = QHeaderView::minimumSectionSize(this_00);
              iVar8 = headerSectionSize(this,iVar6);
              iVar6 = *(int *)(*(long *)&(this_00->super_QAbstractItemView).
                                         super_QAbstractScrollArea.super_QFrame.super_QWidget.
                                         field_0x8 + 0x608);
              if (iVar6 == -1) {
                iVar6 = 0xfffff;
              }
              if (iVar8 <= iVar6) {
                iVar6 = iVar8;
              }
              if (iVar6 <= iVar7) {
                iVar6 = iVar7;
              }
            }
            else {
              iVar6 = QHeaderView::logicalIndex(this_00,iVar6);
              iVar7 = viewSectionSizeHint(this,iVar6);
              iVar6 = QHeaderView::sectionSizeHint(this_00,iVar6);
              if (iVar6 < iVar7) {
                iVar6 = iVar7;
              }
            }
            iVar8 = QHeaderView::minimumSectionSize(this_00);
            iVar7 = *(int *)(*(long *)&(this_00->super_QAbstractItemView).super_QAbstractScrollArea.
                                       super_QFrame.super_QWidget.field_0x8 + 0x608);
            if (iVar7 == -1) {
              iVar7 = 0xfffff;
            }
            if (iVar6 <= iVar7) {
              iVar7 = iVar6;
            }
            if (iVar8 <= iVar7) {
              iVar8 = iVar7;
            }
            QList<int>::append((QList<int> *)&local_58,iVar8);
            uVar14 = uVar14 - iVar8;
            goto LAB_004f78da;
          }
        }
        else if (uVar11 != uVar12) {
          RVar5 = headerSectionResizeMode(this,iVar6);
          goto LAB_004f77e1;
        }
        uVar13 = uVar13 + 1;
        iVar6 = headerSectionSize(this,iVar6);
        QList<int>::append((QList<int> *)&local_58,iVar6);
      }
      else {
        if ((long)(int)(this->sectionItems).d.size <= (long)uVar12) goto LAB_004f78e2;
        if (((this->sectionItems).d.ptr[uVar12].field_0x2 & 0x10) == 0) goto LAB_004f77c6;
      }
LAB_004f78da:
      uVar12 = uVar12 + 1;
    } while( true );
  }
  goto LAB_004f7ae2;
LAB_004f78e2:
  local_90 = 0xffffffff;
  if ((int)uVar13 < 1) {
    local_70 = 0;
  }
  else {
    local_70 = 0;
    local_90 = 0xffffffff;
    if (0 < (int)uVar14) {
      local_90 = QHeaderView::minimumSectionSize(this_00);
      local_70 = (ulong)uVar14 % (ulong)uVar13;
      if ((int)local_90 < (int)(uVar14 / uVar13)) {
        local_90 = uVar14 / uVar13;
      }
    }
  }
  uVar12 = 0;
  local_8c = 0;
  RVar5 = Interactive;
  iVar6 = 0;
  while( true ) {
    HVar1 = this->headerMode;
    if (HVar1 == InitialNoSectionMemoryUsage) {
      iVar7 = (int)this->countInNoSectionItemsMode;
    }
    else {
      iVar7 = (int)(this->sectionItems).d.size;
    }
    if ((long)iVar7 <= (long)uVar12) break;
    iVar7 = (int)uVar12;
    iVar8 = headerSectionSize(this,iVar7);
    RVar9 = headerSectionResizeMode(this,iVar7);
    if ((HVar1 == InitialNoSectionMemoryUsage) ||
       (_t3 = 0, ((this->sectionItems).d.ptr[uVar12].field_0x2 & 0x10) == 0)) {
      RVar10 = RVar9;
      if (uVar11 == uVar12) {
        RVar10 = Stretch;
      }
      if (useGlobalMode) {
        RVar10 = globalMode;
      }
      if ((RVar10 == Stretch) && (local_90 != 0xffffffff)) {
        uVar14 = this->lastSectionSize;
        if (this->lastSectionSize < (int)local_90) {
          uVar14 = local_90;
        }
        if (uVar4 != uVar12) {
          uVar14 = local_90;
        }
        iVar3 = (int)local_70;
        uVar13 = iVar3 - 1;
        if (iVar3 < 1) {
          uVar13 = 0;
        }
        local_70 = (ulong)uVar13;
        _t3 = (0 < iVar3) + uVar14;
        QList<int>::removeFirst((QList<int> *)&local_58);
      }
      else {
        _t3 = QList<int>::takeFirst((QList<int> *)&local_58);
      }
    }
    if (RVar5 == RVar9) {
      if (iVar6 != _t3 && uVar12 != 0) {
LAB_004f7a5e:
        createSectionItems(this,local_8c,iVar7 + -1,iVar6,RVar5);
        local_8c = iVar7;
      }
    }
    else if (uVar12 != 0) goto LAB_004f7a5e;
    if (_t3 != iVar8) {
      if ((this->logicalIndices).d.size != 0) {
        iVar7 = (this->logicalIndices).d.ptr[uVar12];
      }
      QHeaderView::sectionResized(this_00,iVar7,iVar8,_t3);
    }
    uVar12 = uVar12 + 1;
    RVar5 = RVar9;
    iVar6 = _t3;
  }
  createSectionItems(this,local_8c,iVar7 + -1,iVar6,RVar5);
  this->resizeRecursionBlock = false;
  QWidget::update((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport);
  QArrayDataPointer<int>::~QArrayDataPointer(&local_58);
LAB_004f7ae2:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHeaderViewPrivate::resizeSections(QHeaderView::ResizeMode globalMode, bool useGlobalMode)
{
    Q_Q(QHeaderView);
    //stop the timer in case it is delayed
    delayedResize.stop();

    executePostedLayout();

    if (noSectionMemoryUsage() &&
       (hasAutoResizeSections() || (useGlobalMode && globalResizeMode != QHeaderView::Fixed))) {
        setHeaderMode(HeaderMode::FlexibleWithSectionMemoryUsage);
    }

    if (sectionCount() == 0 )
        return;

    if (resizeRecursionBlock)
        return;
    resizeRecursionBlock = true;

    invalidateCachedSizeHint();
    const int lastSectionVisualIdx = q->visualIndex(lastSectionLogicalIdx);

    // find stretchLastSection if we have it
    int stretchSection = -1;
    if (stretchLastSection && !useGlobalMode)
        stretchSection = lastSectionVisualIdx;

    // count up the number of stretched sections and how much space left for them
    int lengthToStretch = (orientation == Qt::Horizontal ? viewport->width() : viewport->height());
    int numberOfStretchedSections = 0;
    QList<int> section_sizes;
    for (int i = 0; i < sectionCount(); ++i) {
        if (isVisualIndexHidden(i))
            continue;

        QHeaderView::ResizeMode resizeMode;
        if (useGlobalMode && (i != stretchSection))
            resizeMode = globalMode;
        else
            resizeMode = (i == stretchSection ? QHeaderView::Stretch : headerSectionResizeMode(i));

        if (resizeMode == QHeaderView::Stretch) {
            ++numberOfStretchedSections;
            section_sizes.append(headerSectionSize(i));
            continue;
        }

        // because it isn't stretch, determine its width and remove that from lengthToStretch
        int sectionSize = 0;
        if (resizeMode == QHeaderView::Interactive || resizeMode == QHeaderView::Fixed) {
            sectionSize = qBound(q->minimumSectionSize(), headerSectionSize(i), q->maximumSectionSize());
        } else { // resizeMode == QHeaderView::ResizeToContents
            int logicalIndex = q->logicalIndex(i);
            sectionSize = qMax(viewSectionSizeHint(logicalIndex),
                               q->sectionSizeHint(logicalIndex));
        }
        sectionSize = qBound(q->minimumSectionSize(),
                             sectionSize,
                             q->maximumSectionSize());

        section_sizes.append(sectionSize);
        lengthToStretch -= sectionSize;
    }

    // calculate the new length for all of the stretched sections
    int stretchSectionLength = -1;
    int pixelReminder = 0;
    if (numberOfStretchedSections > 0 && lengthToStretch > 0) { // we have room to stretch in
        int hintLengthForEveryStretchedSection = lengthToStretch / numberOfStretchedSections;
        stretchSectionLength = qMax(hintLengthForEveryStretchedSection, q->minimumSectionSize());
        pixelReminder = lengthToStretch % numberOfStretchedSections;
    }

    // ### The code below would be nicer if it was cleaned up a bit (since spans has been replaced with items)
    int spanStartSection = 0;
    int previousSectionLength = 0;

    QHeaderView::ResizeMode previousSectionResizeMode = QHeaderView::Interactive;

    // resize each section along the total length
    for (int i = 0; i < sectionCount(); ++i) {
        int oldSectionLength = headerSectionSize(i);
        int newSectionLength = -1;
        QHeaderView::ResizeMode newSectionResizeMode = headerSectionResizeMode(i);

        if (isVisualIndexHidden(i)) {
            newSectionLength = 0;
        } else {
            QHeaderView::ResizeMode resizeMode;
            if (useGlobalMode)
                resizeMode = globalMode;
            else
                resizeMode = (i == stretchSection
                              ? QHeaderView::Stretch
                              : newSectionResizeMode);
            if (resizeMode == QHeaderView::Stretch && stretchSectionLength != -1) {
                if (i == lastSectionVisualIdx)
                    newSectionLength = qMax(stretchSectionLength, lastSectionSize);
                else
                    newSectionLength = stretchSectionLength;
                if (pixelReminder > 0) {
                    newSectionLength += 1;
                    --pixelReminder;
                }
                section_sizes.removeFirst();
            } else {
                newSectionLength = section_sizes.takeFirst();
            }
        }

        //Q_ASSERT(newSectionLength > 0);
        if ((previousSectionResizeMode != newSectionResizeMode
            || previousSectionLength != newSectionLength) && i > 0) {
            createSectionItems(spanStartSection, i - 1, previousSectionLength, previousSectionResizeMode);
            //Q_ASSERT(headerLength() == length);
            spanStartSection = i;
        }

        if (newSectionLength != oldSectionLength)
            emit q->sectionResized(logicalIndex(i), oldSectionLength, newSectionLength);

        previousSectionLength = newSectionLength;
        previousSectionResizeMode = newSectionResizeMode;
    }

    createSectionItems(spanStartSection, sectionCount() - 1,
                       previousSectionLength, previousSectionResizeMode);
    //Q_ASSERT(headerLength() == length);
    resizeRecursionBlock = false;
    viewport->update();
}